

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O2

Node * __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_false>::CharacterClassPass1<true>
          (Parser<UTF8EncodingPolicyBase<false>,_false> *this)

{
  uint32 *puVar1;
  SurrogatePairTracker *pSVar2;
  code *pcVar3;
  bool bVar4;
  EncodedChar EVar5;
  Char CVar6;
  codepoint_t cVar7;
  uint uVar8;
  uint uVar9;
  undefined4 *puVar10;
  Node *pNVar11;
  MatchSetNode *pMVar12;
  MatchSetNode *this_00;
  MatchSetNode *this_01;
  MatchSetNode *pMVar13;
  AltNode *this_02;
  Char CVar14;
  byte bVar15;
  undefined7 uVar17;
  undefined8 uVar16;
  uint n;
  Char CVar18;
  ArenaAllocator *allocator;
  CharSet<unsigned_int> *pCVar19;
  uint uVar20;
  undefined1 local_900 [8];
  CharSet<unsigned_int> negatedSet;
  codepoint_t lowerCharOfRange;
  undefined1 local_3b0 [8];
  CharSet<unsigned_int> codePointSet;
  MatchSetNode deferredSetNode;
  MatchCharNode deferredCharNode;
  codepoint_t upperCharOfRange;
  uint local_40;
  bool local_32;
  EncodedChar local_31;
  bool previousWasASurrogate;
  
  if (this->unicodeFlagPresent == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x842,"(containsSurrogates ? unicodeFlagPresent : true)",
                       "containsSurrogates ? unicodeFlagPresent : true");
    if (!bVar4) goto LAB_00d2f8b5;
    *puVar10 = 0;
  }
  CharSet<unsigned_int>::CharSet((CharSet<unsigned_int> *)local_3b0);
  MatchSetNode::MatchSetNode
            ((MatchSetNode *)(codePointSet.characterPlanes[0x10].rep.full.direct.vec + 6),false,
             false);
  MatchCharNode::MatchCharNode((MatchCharNode *)(deferredSetNode.set.rep.full.direct.vec + 6),L'\0')
  ;
  local_31 = ECLookahead(this,0);
  if (local_31 == '^') {
    ECConsume(this,1);
  }
  EVar5 = ECLookahead(this,0);
  local_32 = false;
  puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  CVar18 = 0xffffffff;
  uVar16 = 0;
  local_40 = 0xffffffff;
  uVar20 = 0;
  while (EVar5 != ']') {
    deferredCharNode._64_4_ = SUB84(uVar16,0);
    if (EVar5 == '\\') {
      ECConsume(this,1);
    }
    pSVar2 = this->currentSurrogatePairNode;
    CVar14 = CVar18;
    if ((pSVar2 == (SurrogatePairTracker *)0x0) || (pSVar2->location != this->next)) {
      if (EVar5 == '\\') {
        pNVar11 = ClassEscapePass1(this,(MatchCharNode *)
                                        (deferredSetNode.set.rep.full.direct.vec + 6),
                                   (MatchSetNode *)
                                   (codePointSet.characterPlanes[0x10].rep.full.direct.vec + 6),
                                   &local_32);
        if (pNVar11->tag != MatchSet) {
          cVar7 = (codepoint_t)(ushort)deferredCharNode.super_Node.followConsumes.lower;
          goto LAB_00d2f138;
        }
        if (local_40 != 0xffffffff) {
          if (this->unicodeFlagPresent == true) {
            Fail(this,-0x7ff5e9d3);
          }
          CharSet<unsigned_int>::Set((CharSet<unsigned_int> *)local_3b0,this->ctAllocator,0x2d);
        }
        CharSet<unsigned_int>::UnionInPlace
                  ((CharSet<unsigned_int> *)local_3b0,this->ctAllocator,
                   (CharSet<char16_t> *)&deferredSetNode.isNegation);
        uVar17 = (undefined7)((ulong)this >> 8);
        bVar15 = 1;
        CVar18 = 0xffffffff;
        cVar7 = 0xffffffff;
      }
      else {
        if (EVar5 != '-') {
          CVar6 = NextChar(this);
          cVar7 = (codepoint_t)(ushort)CVar6;
          goto LAB_00d2f138;
        }
        if ((CVar18 == 0xffffffff || local_40 != 0xffffffff) ||
           (EVar5 = ECLookahead(this,1), EVar5 == ']')) {
          ECConsume(this,1);
          bVar15 = 0;
          uVar17 = 0;
          CVar18 = local_40;
          cVar7 = 0x2d;
        }
        else {
          ECConsume(this,1);
          bVar15 = 0;
          uVar17 = 0;
          CVar14 = 0xffffffff;
          cVar7 = CVar18;
        }
      }
    }
    else {
      cVar7 = pSVar2->value;
      n = pSVar2->length;
      if (this->inputLim < this->next + n) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar10 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0x86b,"(ECCanConsume(this->currentSurrogatePairNode->length))",
                           "ECCanConsume(this->currentSurrogatePairNode->length)");
        if (!bVar4) goto LAB_00d2f8b5;
        *puVar10 = 0;
        n = this->currentSurrogatePairNode->length;
      }
      ECConsumeMultiUnit(this,n);
      pSVar2 = this->currentSurrogatePairNode;
      (this->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits = pSVar2->multiUnits;
      this->currentSurrogatePairNode = pSVar2->next;
LAB_00d2f138:
      bVar15 = 0;
      uVar17 = 0;
      CVar18 = local_40;
    }
    local_40 = CVar18;
    if ((~(byte)uVar20 & CVar14 == 0xffffffff) == 0) {
      if ((uVar20 & 1) == 0) {
        if (CVar18 == 0xffffffff) {
          CharSet<unsigned_int>::Set((CharSet<unsigned_int> *)local_3b0,this->ctAllocator,CVar14);
          local_40 = 0xffffffff;
          goto LAB_00d2f23f;
        }
        if (cVar7 < CVar18) {
          if (this->unicodeFlagPresent == true) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar10 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                               ,0x8bd,"(!unicodeFlagPresent)","!unicodeFlagPresent");
            if (!bVar4) goto LAB_00d2f8b5;
            *puVar10 = 0;
          }
          Fail(this,-0x7ff5ec63);
        }
        CharSet<unsigned_int>::SetRange
                  ((CharSet<unsigned_int> *)local_3b0,this->ctAllocator,CVar18,cVar7);
      }
      else {
        if (this->unicodeFlagPresent == true) {
          Fail(this,-0x7ff5e9d3);
        }
        if (cVar7 != 0xffffffff) {
          CharSet<unsigned_int>::Set((CharSet<unsigned_int> *)local_3b0,this->ctAllocator,cVar7);
        }
        CharSet<unsigned_int>::Set((CharSet<unsigned_int> *)local_3b0,this->ctAllocator,0x2d);
      }
      local_40 = 0xffffffff;
      cVar7 = 0xffffffff;
    }
LAB_00d2f23f:
    CVar18 = cVar7;
    EVar5 = ECLookahead(this,0);
    uVar16 = CONCAT71(uVar17,bVar15 & EVar5 == '-');
    uVar20 = deferredCharNode._64_4_;
  }
  if (CVar18 != 0xffffffff) {
    CharSet<unsigned_int>::Set((CharSet<unsigned_int> *)local_3b0,this->ctAllocator,CVar18);
  }
  EVar5 = local_31;
  if (this->unicodeFlagPresent == false) {
    uVar8 = CharSet<char16_t>::Count((CharSet<char16_t> *)local_3b0);
    uVar9 = CharSet<unsigned_int>::Count((CharSet<unsigned_int> *)local_3b0);
    if (uVar8 != uVar9) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar10 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x8e2,"(codePointSet.SimpleCharCount() == codePointSet.Count())",
                         "codePointSet.SimpleCharCount() == codePointSet.Count()");
      if (!bVar4) goto LAB_00d2f8b5;
      *puVar10 = 0;
    }
    pMVar12 = (MatchSetNode *)new<Memory::ArenaAllocator>(0x68,this->ctAllocator,0x35916e);
    MatchSetNode::MatchSetNode(pMVar12,EVar5 == '^',true);
    allocator = this->ctAllocator;
    pCVar19 = (CharSet<unsigned_int> *)local_3b0;
  }
  else {
    if (((this->scriptContext->config).threadConfig)->m_ES6Unicode == false) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar10 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x8e9,"(scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())",
                         "scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled()");
      if (!bVar4) goto LAB_00d2f8b5;
      *puVar10 = 0;
    }
    bVar4 = CharSet<unsigned_int>::IsEmpty((CharSet<unsigned_int> *)local_3b0);
    if (bVar4) {
      pMVar12 = (MatchSetNode *)new<Memory::ArenaAllocator>(0x68,this->ctAllocator,0x35916e);
      MatchSetNode::MatchSetNode(pMVar12,false,false);
      return &pMVar12->super_Node;
    }
    if (((EVar5 != '^') && (this->caseInsensitiveFlagPresent == false)) &&
       (bVar4 = CharSet<unsigned_int>::IsSingleton((CharSet<unsigned_int> *)local_3b0), bVar4)) {
      cVar7 = CharSet<unsigned_int>::Singleton((CharSet<unsigned_int> *)local_3b0);
      if (cVar7 < 0x10000) {
        pMVar12 = (MatchSetNode *)new<Memory::ArenaAllocator>(0x48,this->ctAllocator,0x35916e);
        MatchCharNode::MatchCharNode((MatchCharNode *)pMVar12,(Char)cVar7);
      }
      else {
        if (this->unicodeFlagPresent == false) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar10 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0x902,"(unicodeFlagPresent)","unicodeFlagPresent");
          if (!bVar4) goto LAB_00d2f8b5;
          *puVar10 = 0;
        }
        Js::NumberUtilities::CodePointAsSurrogatePair
                  (cVar7,(char16 *)local_900,
                   (char16 *)(negatedSet.characterPlanes[0x10].rep.compact.padding + 8));
        pMVar12 = (MatchSetNode *)
                  CreateSurrogatePairAtom
                            (this,local_900._0_2_,
                             negatedSet.characterPlanes[0x10].rep.full.direct.vec[6]._0_2_);
      }
      CharSet<unsigned_int>::Clear((CharSet<unsigned_int> *)local_3b0,this->ctAllocator);
      return &pMVar12->super_Node;
    }
    CharSet<unsigned_int>::CharSet((CharSet<unsigned_int> *)local_900);
    pCVar19 = (CharSet<unsigned_int> *)local_3b0;
    if (this->caseInsensitiveFlagPresent == false) {
      if (EVar5 == '^') {
        CharSet<unsigned_int>::ToComplement
                  ((CharSet<unsigned_int> *)local_3b0,this->ctAllocator,
                   (CharSet<unsigned_int> *)local_900);
        CharSet<unsigned_int>::FreeBody((CharSet<unsigned_int> *)local_3b0,this->ctAllocator);
        pCVar19 = (CharSet<unsigned_int> *)local_900;
      }
    }
    else {
      puVar1 = negatedSet.characterPlanes[0x10].rep.full.direct.vec + 6;
      CharSet<unsigned_int>::CharSet((CharSet<unsigned_int> *)puVar1);
      CharSet<unsigned_int>::ToEquivClass
                ((CharSet<unsigned_int> *)local_3b0,this->ctAllocator,
                 (CharSet<unsigned_int> *)puVar1);
      uVar8 = CharSet<unsigned_int>::Count((CharSet<unsigned_int> *)puVar1);
      uVar9 = CharSet<unsigned_int>::Count((CharSet<unsigned_int> *)local_3b0);
      if (uVar8 < uVar9) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar10 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0x925,"(caseEquivalent.Count() >= codePointSet.Count())",
                           "caseEquivalent.Count() >= codePointSet.Count()");
        if (!bVar4) goto LAB_00d2f8b5;
        *puVar10 = 0;
      }
      if (EVar5 == '^') {
        CharSet<unsigned_int>::Clear((CharSet<unsigned_int> *)local_3b0,this->ctAllocator);
        puVar1 = negatedSet.characterPlanes[0x10].rep.full.direct.vec + 6;
        CharSet<unsigned_int>::ToComplement
                  ((CharSet<unsigned_int> *)puVar1,this->ctAllocator,
                   (CharSet<unsigned_int> *)local_3b0);
        CharSet<unsigned_int>::FreeBody((CharSet<unsigned_int> *)puVar1,this->ctAllocator);
      }
      else {
        CharSet<unsigned_int>::CloneFrom
                  ((CharSet<unsigned_int> *)local_3b0,this->ctAllocator,
                   (CharSet<unsigned_int> *)
                   (negatedSet.characterPlanes[0x10].rep.full.direct.vec + 6));
      }
    }
    uVar8 = CharSet<unsigned_int>::Count(pCVar19);
    uVar9 = CharSet<char16_t>::Count(pCVar19->characterPlanes);
    if (uVar8 != uVar9) {
      if (uVar9 == 0) {
        this_00 = (MatchSetNode *)0x0;
        pMVar12 = (MatchSetNode *)0x0;
      }
      else {
        bVar4 = CharSet<unsigned_int>::ContainSurrogateCodeUnits(pCVar19);
        pMVar12 = (MatchSetNode *)new<Memory::ArenaAllocator>(0x68,this->ctAllocator,0x35916e);
        MatchSetNode::MatchSetNode(pMVar12,false,false);
        if (bVar4) {
          CharSet<unsigned_int>::CloneNonSurrogateCodeUnitsTo
                    (pCVar19,this->ctAllocator,&pMVar12->set);
          this_00 = (MatchSetNode *)new<Memory::ArenaAllocator>(0x68,this->ctAllocator,0x35916e);
          MatchSetNode::MatchSetNode(this_00,false,false);
          CharSet<unsigned_int>::CloneSurrogateCodeUnitsTo(pCVar19,this->ctAllocator,&this_00->set);
        }
        else {
          CharSet<unsigned_int>::CloneSimpleCharsTo(pCVar19,this->ctAllocator,&pMVar12->set);
          this_00 = (MatchSetNode *)0x0;
        }
      }
      if (this->unicodeFlagPresent == false) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar10 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0x954,"(unicodeFlagPresent)","unicodeFlagPresent");
        if (!bVar4) {
LAB_00d2f8b5:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar10 = 0;
      }
      if (pMVar12 == (MatchSetNode *)0x0) {
        this_01 = (MatchSetNode *)0x0;
      }
      else {
        this_01 = (MatchSetNode *)new<Memory::ArenaAllocator>(0x60,this->ctAllocator,0x35916e);
        AltNode::AltNode((AltNode *)this_01,&pMVar12->super_Node,(AltNode *)0x0);
      }
      negatedSet.characterPlanes[0x10].rep.full.direct.vec[6] = 0;
      deferredCharNode._68_4_ = 0;
      CVar18 = 0x10000;
      pMVar12 = this_01;
      do {
        bVar4 = CharSet<unsigned_int>::GetNextRange
                          (pCVar19,CVar18,
                           (Char *)(negatedSet.characterPlanes[0x10].rep.compact.padding + 8),
                           (Char *)&deferredCharNode.field_0x44);
        if (!bVar4) {
          if (this_00 != (MatchSetNode *)0x0) {
            this_02 = (AltNode *)new<Memory::ArenaAllocator>(0x60,this->ctAllocator,0x35916e);
            AltNode::AltNode(this_02,&this_00->super_Node,(AltNode *)0x0);
            (this_01->set).rep.full.root = (CharSetNode *)this_02;
          }
          CharSet<unsigned_int>::Clear(pCVar19,this->ctAllocator);
          if (pMVar12 != (MatchSetNode *)0x0) {
            if ((pMVar12->set).rep.compact.countPlusOne != 0) {
              return &pMVar12->super_Node;
            }
            uVar16._0_1_ = pMVar12->isNegation;
            uVar16._1_1_ = pMVar12->needsEquivClass;
            uVar16._2_6_ = *(undefined6 *)&pMVar12->field_0x3a;
            return (Node *)uVar16;
          }
          return &((MatchSetNode *)0x0)->super_Node;
        }
        if (negatedSet.characterPlanes[0x10].rep.full.direct.vec[6] == deferredCharNode._68_4_) {
          pMVar13 = (MatchSetNode *)
                    AppendSurrogatePairToDisjunction
                              (this,negatedSet.characterPlanes[0x10].rep.full.direct.vec[6],
                               (AltNode *)this_01);
        }
        else {
          pMVar13 = (MatchSetNode *)
                    AppendSurrogateRangeToDisjunction
                              (this,negatedSet.characterPlanes[0x10].rep.full.direct.vec[6],
                               deferredCharNode._68_4_,(AltNode *)this_01);
        }
        if (pMVar12 == (MatchSetNode *)0x0) {
          pMVar12 = pMVar13;
        }
        if (pMVar13 == (MatchSetNode *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar10 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0x96a,"(currentTail != nullptr)","currentTail != nullptr");
          if (!bVar4) goto LAB_00d2f8b5;
          *puVar10 = 0;
        }
        do {
          this_01 = pMVar13;
          pMVar13 = (MatchSetNode *)(this_01->set).rep.full.root;
        } while (pMVar13 != (MatchSetNode *)0x0);
        CVar18 = deferredCharNode._68_4_ + 1;
      } while( true );
    }
    pMVar12 = (MatchSetNode *)new<Memory::ArenaAllocator>(0x68,this->ctAllocator,0x35916e);
    MatchSetNode::MatchSetNode(pMVar12,EVar5 == '^',true);
    allocator = this->ctAllocator;
  }
  CharSet<unsigned_int>::CloneSimpleCharsTo(pCVar19,allocator,&pMVar12->set);
  return &pMVar12->super_Node;
}

Assistant:

Node* Parser<P, IsLiteral>::CharacterClassPass1()
    {
        Assert(containsSurrogates ? unicodeFlagPresent : true);

        CharSet<codepoint_t> codePointSet;

        MatchSetNode deferredSetNode(false, false);
        MatchCharNode deferredCharNode(0);

        bool isNegation = false;

        if (ECLookahead() == '^')
        {
            isNegation = true;
            ECConsume();
        }

        // We aren't expecting any terminating null characters, only embedded ones that should treated as valid characters.
        // CharacterClassPass0 should have taken care of terminating null.
        codepoint_t pendingCodePoint = INVALID_CODEPOINT;
        codepoint_t pendingRangeStart = INVALID_CODEPOINT;
        EncodedChar nextChar = ECLookahead();
        bool previousWasASurrogate = false;
        bool currIsACharSet = false;
        bool prevWasACharSetAndPartOfRange = false;
        bool prevprevWasACharSetAndPartOfRange = false;

        while(nextChar != ']')
        {
            codepoint_t codePointToSet = INVALID_CODEPOINT;

            // Consume ahead of time if we have two backslashes, both cases below (previously Tracked surrogate pair, and ClassEscapePass1) assume it is.
            if (nextChar == '\\')
            {
                ECConsume();
            }

            // These if-blocks are the logical ClassAtomPass1, they weren't grouped into a method to simplify dealing with multiple out parameters.
            if (containsSurrogates && this->currentSurrogatePairNode != nullptr && this->currentSurrogatePairNode->location == this->next)
            {
                codePointToSet = pendingCodePoint;

                pendingCodePoint = this->currentSurrogatePairNode->value;
                Assert(ECCanConsume(this->currentSurrogatePairNode->length));
                ECConsumeMultiUnit(this->currentSurrogatePairNode->length);
                this->RestoreMultiUnits(this->currentSurrogatePairNode->multiUnits);
                this->currentSurrogatePairNode = this->currentSurrogatePairNode->next;
            }
            else if (nextChar == '\\')
            {
                Node* returnedNode = ClassEscapePass1(&deferredCharNode, &deferredSetNode, previousWasASurrogate);
                codePointToSet = pendingCodePoint;

                if (returnedNode->tag == Node::MatchSet)
                {
                    if (pendingRangeStart != INVALID_CODEPOINT)
                    {
                        if (unicodeFlagPresent)
                        {
                            //A range containing a character class and the unicode flag is present, thus we end up having to throw a "Syntax" error here
                            //This breaks the notion of Pass0 check for valid syntax, because during that time, the unicode flag is unknown.
                            Fail(JSERR_UnicodeRegExpRangeContainsCharClass); //From #sec-patterns-static-semantics-early-errors-annexb
                        }

                        codePointSet.Set(ctAllocator, '-');
                    }

                    pendingCodePoint = INVALID_CODEPOINT;
                    pendingRangeStart = INVALID_CODEPOINT;
                    codePointSet.UnionInPlace(ctAllocator, deferredSetNode.set);
                    currIsACharSet = true;
                }
                else
                {
                    // Just a character
                    pendingCodePoint = deferredCharNode.cs[0];
                }
            }
            else if (nextChar == '-')
            {
                if (pendingRangeStart != INVALID_CODEPOINT || pendingCodePoint == INVALID_CODEPOINT || ECLookahead(1) == ']')
                {
                    // - is just a char, or end of a range.
                    codePointToSet = pendingCodePoint;
                    pendingCodePoint = '-';
                    ECConsume();
                }
                else
                {
                    pendingRangeStart = pendingCodePoint;
                    ECConsume();
                }
            }
            else
            {
                // Just a character, consume it
                codePointToSet = pendingCodePoint;
                pendingCodePoint = NextChar();
            }

            if (codePointToSet != INVALID_CODEPOINT || prevprevWasACharSetAndPartOfRange)
            {
                if (prevprevWasACharSetAndPartOfRange)
                {
                    //A range containing a character class and the unicode flag is present, thus we end up having to throw a "Syntax" error here
                    //This breaks the notion of Pass0 check for valid syntax, because during that time, the unicode flag is unknown.
                    if (unicodeFlagPresent)
                    {
                        Fail(JSERR_UnicodeRegExpRangeContainsCharClass);
                    }

                    if (pendingCodePoint != INVALID_CODEPOINT)
                    {
                        codePointSet.Set(ctAllocator, pendingCodePoint);
                    }

                    codePointSet.Set(ctAllocator, '-'); //Add '-' to set because a range was detected but turned out to be a union of character set with '-' and another atom.
                    pendingRangeStart = pendingCodePoint = INVALID_CODEPOINT;
                }
                else if (pendingRangeStart != INVALID_CODEPOINT)
                {
                    if (pendingRangeStart > pendingCodePoint)
                    {
                        //We have no unicodeFlag, but current range contains surrogates, thus we may end up having to throw a "Syntax" error here
                        //This breaks the notion of Pass0 check for valid syntax, because we don't know if we have a unicode option
                        Assert(!unicodeFlagPresent);
                        Fail(JSERR_RegExpBadRange);
                    }
                    
                    codePointSet.SetRange(ctAllocator, pendingRangeStart, pendingCodePoint);
                    pendingRangeStart = pendingCodePoint = INVALID_CODEPOINT;
                }
                else
                {
                    codePointSet.Set(ctAllocator, codePointToSet);
                }
            }

            nextChar = ECLookahead();
            prevprevWasACharSetAndPartOfRange = prevWasACharSetAndPartOfRange;
            prevWasACharSetAndPartOfRange = currIsACharSet && nextChar == '-';
            currIsACharSet = false;
        }

        if (pendingCodePoint != INVALID_CODEPOINT)
        {
            codePointSet.Set(ctAllocator, pendingCodePoint);
        }

        // At this point, we have a complete set of codepoints representing the range.
        // Before performing translation of any kind, we need to do some case filling.
        // At the point of this comment, there are no case mappings going cross-plane between simple
        // characters (< 0x10000) and supplementary characters (>= 0x10000)
        // However, it might still be the case, and this has to be handled.

        // On the other hand, we don't want to prevent optimizations that expect non-casefolded sets from happening.
        // At least for simple characters.

        // The simple case, is when the unicode flag isn't specified, we can go ahead and return the simple set.
        // Negations and case mappings will be handled later.
        if (!unicodeFlagPresent)
        {
            Assert(codePointSet.SimpleCharCount() == codePointSet.Count());
            MatchSetNode *simpleToReturn = Anew(ctAllocator, MatchSetNode, isNegation);
            codePointSet.CloneSimpleCharsTo(ctAllocator, simpleToReturn->set);
            return simpleToReturn;
        }

        // Everything past here must be under the flag
        Assert(scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled());

        if (codePointSet.IsEmpty())
        {
            return Anew(ctAllocator, MatchSetNode, false, false);
        }

        Node* prefixNode = nullptr;
        Node* suffixNode = nullptr;

        CharSet<codepoint_t> *toUseForTranslation = &codePointSet;

        // If a singleton, return a simple character
        bool isSingleton = !this->caseInsensitiveFlagPresent && !isNegation && codePointSet.IsSingleton();
        if (isSingleton)
        {
            codepoint_t singleton = codePointSet.Singleton();
            Node* toReturn = nullptr;

            if (singleton < 0x10000)
            {
                toReturn = Anew(ctAllocator, MatchCharNode, (char16)singleton);
            }
            else
            {
                Assert(unicodeFlagPresent);
                char16 lowerSurrogate, upperSurrogate;
                Js::NumberUtilities::CodePointAsSurrogatePair(singleton, &lowerSurrogate, &upperSurrogate);
                toReturn = CreateSurrogatePairAtom(lowerSurrogate, upperSurrogate);
            }

            codePointSet.Clear(ctAllocator);
            return toReturn;
        }

        // If negation, we want to complement the simple chars.
        // When a set is negated, optimizations skip checking if applicable, so we can go ahead and negate it here.
        CharSet<codepoint_t> negatedSet;

        if (!this->caseInsensitiveFlagPresent)
        {
            if (isNegation)
            {
                // Complement all characters, and use it as the set toTranslate
                codePointSet.ToComplement(ctAllocator, negatedSet);
            }

            toUseForTranslation = isNegation ? &negatedSet : &codePointSet;

            if (isNegation)
            {
                // Clear this, as we will no longer need this.
                codePointSet.FreeBody(ctAllocator);
            }
        }
        else
        {
            CharSet<codepoint_t> caseEquivalent;
            codePointSet.ToEquivClass(ctAllocator, caseEquivalent);
            // Equiv set can't have a reduced count of chars
            Assert(caseEquivalent.Count() >= codePointSet.Count());

            // Here we have a regex that has both case insensitive and unicode options.
            // The range might also be negated. If it is negated, we can go ahead and negate
            // the entire set as well as fill in cases, as optimizations wouldn't kick in anyways.
            if (isNegation)
            {
                codePointSet.Clear(ctAllocator);
                caseEquivalent.ToComplement(ctAllocator, codePointSet);
                caseEquivalent.FreeBody(ctAllocator);
            }
            else
            {
                codePointSet.CloneFrom(ctAllocator, caseEquivalent);
            }

            Assert(toUseForTranslation == &codePointSet);
        }

        uint totalCodePointsCount = toUseForTranslation->Count();
        uint simpleCharsCount = toUseForTranslation->SimpleCharCount();
        if (totalCodePointsCount == simpleCharsCount)
        {
            MatchSetNode *simpleToReturn = Anew(ctAllocator, MatchSetNode, isNegation);
            toUseForTranslation->CloneSimpleCharsTo(ctAllocator, simpleToReturn->set);
            return simpleToReturn;
        }

        if  (simpleCharsCount > 0)
        {
            if (!toUseForTranslation->ContainSurrogateCodeUnits())
            {
                MatchSetNode *node = Anew(ctAllocator, MatchSetNode, false, false);
                toUseForTranslation->CloneSimpleCharsTo(ctAllocator, node->set);
                prefixNode = node;
            }
            else
            {
                MatchSetNode *node = Anew(ctAllocator, MatchSetNode, false, false);
                toUseForTranslation->CloneNonSurrogateCodeUnitsTo(ctAllocator, node->set);
                prefixNode = node;
                node = Anew(ctAllocator, MatchSetNode, false, false);
                toUseForTranslation->CloneSurrogateCodeUnitsTo(ctAllocator, node->set);
                suffixNode = node;
            }
        }

        Assert(unicodeFlagPresent);
        AltNode *headToReturn = prefixNode == nullptr ? nullptr : Anew(ctAllocator, AltNode, prefixNode, nullptr);
        AltNode *currentTail = headToReturn;

        codepoint_t charRangeSearchIndex = 0x10000, lowerCharOfRange = 0, upperCharOfRange = 0;

        while (toUseForTranslation->GetNextRange(charRangeSearchIndex, &lowerCharOfRange, &upperCharOfRange))
        {
            if (lowerCharOfRange == upperCharOfRange)
            {
                currentTail = this->AppendSurrogatePairToDisjunction(lowerCharOfRange, currentTail);
            }
            else
            {
                currentTail = this->AppendSurrogateRangeToDisjunction(lowerCharOfRange, upperCharOfRange, currentTail);
            }

            if (headToReturn == nullptr)
            {
                headToReturn = currentTail;
            }

            AnalysisAssert(currentTail != nullptr);
            while (currentTail->tail != nullptr)
            {
                currentTail = currentTail->tail;
            }
            charRangeSearchIndex = upperCharOfRange + 1;
        }

        if (suffixNode != nullptr)
        {
            currentTail->tail = Anew(ctAllocator, AltNode, suffixNode, nullptr);
        }
        toUseForTranslation->Clear(ctAllocator);

        if (headToReturn != nullptr && headToReturn->tail == nullptr)
        {
            return headToReturn->head;
        }
        return headToReturn;
    }